

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::TextureViewTestReferenceCounting::iterate(TextureViewTestReferenceCounting *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestError *pTVar5;
  ulong uVar6;
  size_type sVar7;
  TestLog *this_02;
  MessageBuilder *pMVar8;
  MessageBuilder local_208;
  uint local_84;
  long lStack_80;
  uint n_mipmap_1;
  GLint *run_results_ptr;
  _norm_vec4 *expected_mipmap_color;
  int local_68;
  uint n_mipmap;
  GLint to_id;
  uint n_texture;
  GLuint to_ids_to_sample [3];
  uint n_iteration;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  TextureViewTestReferenceCounting *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_texture_view");
  if (!bVar1) {
    to_ids_to_sample[2]._3_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_texture_view is not supported",&local_39);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
    to_ids_to_sample[2]._3_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  (**(code **)(local_18 + 8))(0x84c0);
  dVar3 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar3,"glActiveTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x27a2);
  (**(code **)(local_18 + 0x1680))(this->m_po_id);
  dVar3 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar3,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x27a6);
  to_ids_to_sample[1] = 0;
  do {
    if (2 < to_ids_to_sample[1]) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    to_ids_to_sample[0] = 0;
    _to_id = 0;
    if (to_ids_to_sample[1] == 0) {
      _to_id = CONCAT44(this->m_view_to_id,this->m_parent_to_id);
      to_ids_to_sample[0] = this->m_view_view_to_id;
    }
    else if (to_ids_to_sample[1] == 1) {
      to_id = this->m_view_to_id;
      n_texture = this->m_view_view_to_id;
    }
    else {
      if (to_ids_to_sample[1] != 2) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid iteration index",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x27d2);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      _to_id = (ulong)this->m_view_view_to_id;
    }
    for (n_mipmap = 0; n_mipmap < 3; n_mipmap = n_mipmap + 1) {
      local_68 = (&to_id)[n_mipmap];
      if (local_68 != 0) {
        (**(code **)(local_18 + 0xb8))(0xde1,local_68);
        dVar3 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar3,"glBindTexture() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x27e3);
        (**(code **)(local_18 + 0x30))(0);
        dVar3 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar3,"glBeginTransformFeedback() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x27e7);
        for (expected_mipmap_color._4_4_ = 0; uVar6 = (ulong)expected_mipmap_color._4_4_,
            sVar7 = std::
                    vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                    ::size(&this->m_mipmap_colors), uVar6 < sVar7;
            expected_mipmap_color._4_4_ = expected_mipmap_color._4_4_ + 1) {
          run_results_ptr =
               (GLint *)std::
                        vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                        ::operator[](&this->m_mipmap_colors,(ulong)expected_mipmap_color._4_4_);
          (**(code **)(local_18 + 0x15a0))
                    ((float)((reference)run_results_ptr)->rgba[0] / 255.0,
                     (float)((reference)run_results_ptr)->rgba[1] / 255.0,
                     (float)((reference)run_results_ptr)->rgba[2] / 255.0,
                     (float)((reference)run_results_ptr)->rgba[3] / 255.0,
                     this->m_po_expected_texel_uniform_location);
          dVar3 = (**(code **)(local_18 + 0x800))();
          glu::checkError(dVar3,"glUniform4f() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x27f3);
          (**(code **)(local_18 + 0x14f0))
                    (this->m_po_lod_uniform_location,expected_mipmap_color._4_4_);
          dVar3 = (**(code **)(local_18 + 0x800))();
          glu::checkError(dVar3,"glUniform1i() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x27f6);
          (**(code **)(local_18 + 0x538))(0,0,1);
          dVar3 = (**(code **)(local_18 + 0x800))();
          glu::checkError(dVar3,"glDrawArrays() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x27fb);
        }
        (**(code **)(local_18 + 0x638))();
        dVar3 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar3,"glEndTransformFeedback() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x2800);
        lStack_80 = (**(code **)(local_18 + 0xcf8))(0x8c8e,35000);
        dVar3 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar3,"glMapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x2808);
        if (lStack_80 == 0) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Pointer to mapped buffer object storage is NULL.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x280c);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        for (local_84 = 0; uVar6 = (ulong)local_84,
            sVar7 = std::
                    vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                    ::size(&this->m_mipmap_colors), uVar6 < sVar7; local_84 = local_84 + 1) {
          if (*(int *)(lStack_80 + (ulong)local_84 * 4) != 1) {
            (**(code **)(local_18 + 0x1670))(0x8c8e);
            this_02 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_208,this_02,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar8 = tcu::MessageBuilder::operator<<
                               (&local_208,
                                (char (*) [45])"Invalid data was sampled for mip-map level [");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_84);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"] and iteration [");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,to_ids_to_sample + 1);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29ea7ce);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_208);
            pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar5,"Mip-map sampling failed.",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x281b);
            __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
        (**(code **)(local_18 + 0x1670))(0x8c8e);
        dVar3 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar3,"glUnmapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x2821);
      }
    }
    if (to_ids_to_sample[1] == 0) {
      (**(code **)(local_18 + 0x480))(1,&this->m_parent_to_id);
      dVar3 = (**(code **)(local_18 + 0x800))();
      glu::checkError(dVar3,"glDeleteTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x282c);
      this->m_parent_to_id = 0;
    }
    else if (to_ids_to_sample[1] == 1) {
      (**(code **)(local_18 + 0x480))(1,&this->m_view_to_id);
      dVar3 = (**(code **)(local_18 + 0x800))();
      glu::checkError(dVar3,"glDeleteTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x2835);
      this->m_view_to_id = 0;
    }
    else {
      if (to_ids_to_sample[1] != 2) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid iteration index",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x2845);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(local_18 + 0x480))(1,&this->m_view_view_to_id);
      dVar3 = (**(code **)(local_18 + 0x800))();
      glu::checkError(dVar3,"glDeleteTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x283e);
      this->m_view_view_to_id = 0;
    }
    to_ids_to_sample[1] = to_ids_to_sample[1] + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureViewTestReferenceCounting::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Carry on only if GL_ARB_texture_view extension is supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_view"))
	{
		throw tcu::NotSupportedError("GL_ARB_texture_view is not supported");
	}

	/* Initialize all GL objects used for the test */
	initTest();

	/* Make sure texture unit 0 is currently active */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

	/* Activate the test program object */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Run the test in three iterations:
	 *
	 * - Sample both the texture and all the views; once that's finished
	 *   successfully, delete the parent texture.
	 * - Sample both views; once that's finished successfully, delete
	 *   the first of the views;
	 * - Sample the only remaining view and make sure all mip-maps store
	 *   valid colors.
	 **/
	for (unsigned int n_iteration = 0; n_iteration < 3; /* iterations in total */
		 n_iteration++)
	{
		glw::GLuint to_ids_to_sample[3] = { 0, 0, 0 };

		/* Configure IDs of textures we need to validate for current iteration */
		switch (n_iteration)
		{
		case 0:
		{
			to_ids_to_sample[0] = m_parent_to_id;
			to_ids_to_sample[1] = m_view_to_id;
			to_ids_to_sample[2] = m_view_view_to_id;

			break;
		}

		case 1:
		{
			to_ids_to_sample[0] = m_view_to_id;
			to_ids_to_sample[1] = m_view_view_to_id;

			break;
		}

		case 2:
		{
			to_ids_to_sample[0] = m_view_view_to_id;

			break;
		}

		default:
			TCU_FAIL("Invalid iteration index");
		} /* switch (n_iteration) */

		/* Iterate through all texture objects of our concern */
		for (unsigned int n_texture = 0; n_texture < sizeof(to_ids_to_sample) / sizeof(to_ids_to_sample[0]);
			 n_texture++)
		{
			glw::GLint to_id = to_ids_to_sample[n_texture];

			if (to_id == 0)
			{
				/* No texture object to sample from. */
				continue;
			}

			/* Bind the texture object of our interest to GL_TEXTURE_2D */
			gl.bindTexture(GL_TEXTURE_2D, to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

			/* Start XFB */
			gl.beginTransformFeedback(GL_POINTS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");

			/* Iterate through all mip-maps of the texture we're currently sampling */
			for (unsigned int n_mipmap = 0; n_mipmap < m_mipmap_colors.size(); ++n_mipmap)
			{
				const _norm_vec4& expected_mipmap_color = m_mipmap_colors[n_mipmap];

				/* Update uniforms first */
				gl.uniform4f(m_po_expected_texel_uniform_location, (float)(expected_mipmap_color.rgba[0]) / 255.0f,
							 (float)(expected_mipmap_color.rgba[1]) / 255.0f,
							 (float)(expected_mipmap_color.rgba[2]) / 255.0f,
							 (float)(expected_mipmap_color.rgba[3]) / 255.0f);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4f() call failed.");

				gl.uniform1i(m_po_lod_uniform_location, n_mipmap);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

				/* Draw a single point. That'll feed the XFB buffer object with a single bool
				 * indicating if the test passed for the mip-map, or not */
				gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
			} /* for (all mip-maps) */

			/* We're done - close XFB */
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

			/* How did the sampling go? Map the buffer object containing the run
			 * results into process space.
			 */
			const glw::GLint* run_results_ptr =
				(const glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

			if (run_results_ptr == NULL)
			{
				TCU_FAIL("Pointer to mapped buffer object storage is NULL.");
			}

			/* Make sure all mip-maps were sampled successfully */
			for (unsigned int n_mipmap = 0; n_mipmap < m_mipmap_colors.size(); ++n_mipmap)
			{
				if (run_results_ptr[n_mipmap] != 1)
				{
					/* Make sure the TF BO is unmapped before we throw the exception */
					gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data was sampled for mip-map level ["
									   << n_mipmap << "] and iteration [" << n_iteration << "]"
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Mip-map sampling failed.");
				}
			} /* for (all mip-maps) */

			/* Good to unmap the buffer object at this point */
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
		} /* for (all initialized texture objects) */

		/* Now that we're done with the iteration, we should delete iteration-specific texture
		 * object.
		 */
		switch (n_iteration)
		{
		case 0:
		{
			gl.deleteTextures(1, &m_parent_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");

			m_parent_to_id = 0;
			break;
		}

		case 1:
		{
			gl.deleteTextures(1, &m_view_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");

			m_view_to_id = 0;
			break;
		}

		case 2:
		{
			gl.deleteTextures(1, &m_view_view_to_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");

			m_view_view_to_id = 0;
			break;
		}

		default:
			TCU_FAIL("Invalid iteration index");
		} /* switch (n_iteration) */
	}	 /* for (all iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}